

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O0

uint __thiscall NetworkNS::RanMars::uint_rand(RanMars *this)

{
  unsigned_long_long t;
  RanMars *this_local;
  
  this->x = this->x * 0x12bf507d + 0x12d687;
  this->y = this->y << 5 ^ this->y;
  this->y = this->y >> 7 ^ this->y;
  this->y = this->y << 0x16 ^ this->y;
  *(ulong *)&this->z = (ulong)this->z * 0xfffa2849 + (ulong)this->c;
  return this->x + this->y + this->z;
}

Assistant:

unsigned int RanMars::uint_rand()
    {
        unsigned long long t;
        x = 314527869 * x + 1234567;
        y ^= y << 5;
        y ^= y >> 7;
        y ^= y << 22;
        t = 4294584393ULL * z + c;
        c = t >> 32;
        z = t;
        return x + y + z;
    }